

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O0

int __thiscall Individual::valueFunction(Individual *this,shared_ptr<Instance> *myInstance)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  reference piVar5;
  reference pvVar6;
  int *piVar7;
  iterator iStack_68;
  int task;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int local_48;
  int maxSoFar;
  int i;
  allocator<int> local_35;
  value_type_conflict local_34;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> Cores;
  shared_ptr<Instance> *myInstance_local;
  Individual *this_local;
  
  Cores.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)myInstance;
  peVar4 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      myInstance);
  iVar2 = Instance::getNumProcessors(peVar4);
  local_34 = 0;
  std::allocator<int>::allocator(&local_35);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,(long)iVar2,&local_34,&local_35);
  std::allocator<int>::~allocator(&local_35);
  local_48 = 0;
  __range1._4_4_ = 0;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(&this->coresAsignedToTasks);
  iStack_68 = std::vector<int,_std::allocator<int>_>::end(&this->coresAsignedToTasks);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff98);
    iVar2 = __range1._4_4_;
    if (!bVar1) break;
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    iVar2 = *piVar5;
    peVar4 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        myInstance);
    iVar3 = Instance::getNthTaskLength(peVar4,local_48);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,(long)iVar2);
    *pvVar6 = *pvVar6 + iVar3;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,(long)iVar2);
    piVar7 = std::max<int>((int *)((long)&__range1 + 4),pvVar6);
    __range1._4_4_ = *piVar7;
    local_48 = local_48 + 1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return iVar2;
}

Assistant:

int Individual::valueFunction(std::shared_ptr<Instance> myInstance){
	vector<int> Cores(myInstance->getNumProcessors(),0);
	int i = 0;
	int maxSoFar = 0;
	for(auto task : coresAsignedToTasks){
		Cores[task] += myInstance->getNthTaskLength(i);
		maxSoFar = max(maxSoFar,Cores[task]);
		i++;
	}
	return maxSoFar;
}